

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2text.c
# Opt level: O0

int print_labeled_bignum(BIO *out,char *label,BIGNUM *bn)

{
  BIO *bio;
  int iVar1;
  uint uVar2;
  uint uVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  BIGNUM *in_RDX;
  char *in_RSI;
  BIO *in_RDI;
  unsigned_long *words;
  int bytes;
  char *neg;
  char *post_label_spc;
  char spaces [5];
  char *p;
  char *hex_str;
  int use_sep;
  int ret;
  int local_54;
  char *local_50;
  char *local_48;
  undefined4 local_3d;
  undefined1 local_39;
  char *local_38;
  char *local_30;
  int local_28;
  int local_24;
  BIGNUM *local_20;
  char *local_18;
  BIO *local_10;
  
  local_24 = 0;
  local_28 = 0;
  local_30 = (char *)0x0;
  local_3d = 0x20202020;
  local_39 = 0;
  local_48 = " ";
  local_50 = "";
  if (in_RDX == (BIGNUM *)0x0) {
    return 0;
  }
  local_18 = in_RSI;
  if (in_RSI == (char *)0x0) {
    local_18 = "";
    local_48 = "";
  }
  local_20 = (BIGNUM *)in_RDX;
  local_10 = in_RDI;
  iVar1 = BN_is_zero(in_RDX);
  if (iVar1 != 0) {
    iVar1 = BIO_printf(local_10,"%s%s0\n",local_18,local_48);
    return iVar1;
  }
  iVar1 = BN_num_bits(local_20);
  if ((iVar1 + 7) / 8 < 9) {
    puVar4 = bn_get_words((BIGNUM *)local_20);
    iVar1 = BN_is_negative((BIGNUM *)local_20);
    if (iVar1 != 0) {
      local_50 = "-";
    }
    iVar1 = BIO_printf(local_10,"%s%s%s%lu (%s0x%lx)\n",local_18,local_48,local_50,*puVar4,local_50,
                       *puVar4);
    return iVar1;
  }
  local_30 = BN_bn2hex(local_20);
  local_38 = local_30;
  if (*local_30 == '-') {
    local_38 = local_30 + 1;
    local_50 = " (Negative)";
  }
  iVar1 = BIO_printf(local_10,"%s%s\n",local_18,local_50);
  if (0 < iVar1) {
    local_54 = 0;
    iVar1 = BIO_printf(local_10,"%s",&local_3d);
    if (0 < iVar1) {
      if ('7' < *local_38) {
        iVar1 = BIO_printf(local_10,"%02x",0);
        if (iVar1 < 1) goto LAB_0031fe15;
        local_54 = 1;
        local_28 = 1;
      }
      for (; *local_38 != '\0'; local_38 = local_38 + 2) {
        if ((local_54 % 0xf == 0) && (0 < local_54)) {
          iVar1 = BIO_printf(local_10,":\n%s",&local_3d);
          if (iVar1 < 1) goto LAB_0031fe15;
          local_28 = 0;
        }
        bio = local_10;
        pcVar5 = "";
        if (local_28 != 0) {
          pcVar5 = ":";
        }
        uVar2 = tolower((int)*local_38);
        uVar3 = tolower((int)local_38[1]);
        iVar1 = BIO_printf(bio,"%s%c%c",pcVar5,(ulong)uVar2,(ulong)uVar3);
        if (iVar1 < 1) goto LAB_0031fe15;
        local_54 = local_54 + 1;
        local_28 = 1;
      }
      iVar1 = BIO_printf(local_10,"\n");
      if (0 < iVar1) {
        local_24 = 1;
      }
    }
  }
LAB_0031fe15:
  CRYPTO_free(local_30);
  return local_24;
}

Assistant:

static int print_labeled_bignum(BIO *out, const char *label, const BIGNUM *bn)
{
    int ret = 0, use_sep = 0;
    char *hex_str = NULL, *p;
    const char spaces[] = "    ";
    const char *post_label_spc = " ";

    const char *neg = "";
    int bytes;

    if (bn == NULL)
        return 0;
    if (label == NULL) {
        label = "";
        post_label_spc = "";
    }

    if (BN_is_zero(bn))
        return BIO_printf(out, "%s%s0\n", label, post_label_spc);

    if (BN_num_bytes(bn) <= BN_BYTES) {
        BN_ULONG *words = bn_get_words(bn);

        if (BN_is_negative(bn))
            neg = "-";

        return BIO_printf(out, "%s%s%s" BN_FMTu " (%s0x" BN_FMTx ")\n",
                          label, post_label_spc, neg, words[0], neg, words[0]);
    }

    hex_str = BN_bn2hex(bn);
    p = hex_str;
    if (*p == '-') {
        ++p;
        neg = " (Negative)";
    }
    if (BIO_printf(out, "%s%s\n", label, neg) <= 0)
        goto err;

    /* Keep track of how many bytes we have printed out so far */
    bytes = 0;

    if (BIO_printf(out, "%s", spaces) <= 0)
        goto err;

    /* Add a leading 00 if the top bit is set */
    if (*p >= '8') {
        if (BIO_printf(out, "%02x", 0) <= 0)
            goto err;
        ++bytes;
        use_sep = 1;
    }
    while (*p != '\0') {
        /* Do a newline after every 15 hex bytes + add the space indent */
        if ((bytes % 15) == 0 && bytes > 0) {
            if (BIO_printf(out, ":\n%s", spaces) <= 0)
                goto err;
            use_sep = 0; /* The first byte on the next line doesnt have a : */
        }
        if (BIO_printf(out, "%s%c%c", use_sep ? ":" : "",
                       tolower(p[0]), tolower(p[1])) <= 0)
            goto err;
        ++bytes;
        p += 2;
        use_sep = 1;
    }
    if (BIO_printf(out, "\n") <= 0)
        goto err;
    ret = 1;
err:
    OPENSSL_free(hex_str);
    return ret;
}